

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void rw::extendStrip(StripMesh *sm,StripNode *start)

{
  int32 iVar1;
  StripNode *pSVar2;
  int local_2c;
  int32 i;
  StripNode *nn;
  StripNode *n;
  StripNode *start_local;
  StripMesh *sm_local;
  
  iVar1 = numConnections(start);
  if (iVar1 == 0) {
    LinkList::append(&sm->loneNodes,&start->inlist);
    return;
  }
  LinkList::append(&sm->endNodes,&start->inlist);
  start->field_0x6 = start->field_0x6 & 0xef | 0x10;
  nn = start;
  do {
    local_2c = 0;
    while( true ) {
      if (2 < local_2c) {
        if (nn == start) {
          return;
        }
        LinkList::append(&sm->endNodes,&nn->inlist);
        nn->field_0x6 = nn->field_0x6 & 0xef | 0x10;
        return;
      }
      if (((nn->e[local_2c].field_0x4 & 1) != 0) &&
         (pSVar2 = sm->nodes + nn->e[local_2c].node, pSVar2->stripId < 0)) break;
      local_2c = local_2c + 1;
    }
    pSVar2->stripId = nn->stripId;
    complementEdge(sm,nn->e + local_2c);
    nn = pSVar2;
  } while( true );
}

Assistant:

static void
extendStrip(StripMesh *sm, StripNode *start)
{
	StripNode *n, *nn;
	n = start;
	if(numConnections(n) == 0){
		sm->loneNodes.append(&n->inlist);
		return;
	}
	sm->endNodes.append(&n->inlist);
	n->isEnd = 1;
loop:
	/* Find the next node to connect to on any of the three edges */
	for(int32 i = 0; i < 3; i++){
		if(!n->e[i].isConnected)
			continue;
		nn = &sm->nodes[n->e[i].node];
		if(nn->stripId >= 0)
			continue;

		/* found one */
		nn->stripId = n->stripId;
		/* We know it's not a strip edge yet,
		 * so complementing it will make it one. */
		complementEdge(sm, &n->e[i]);
		n = nn;
		goto loop;
	}
	if(n != start){
		sm->endNodes.append(&n->inlist);
		n->isEnd = 1;
	}
}